

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O1

void __thiscall
ins_ekf::InsEkf::ProcessMeasurement
          (InsEkf *this,vector<double,_std::allocator<double>_> *measurement,double dt)

{
  double *pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar5;
  ulong uVar6;
  VectorXd gps_meas;
  Vector3d axyz_meas;
  Vector3d pqr_meas;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_a8;
  double local_88;
  double local_80;
  double *local_78;
  long local_70;
  Matrix<double,_3,_1,_0,_3,_1> local_68;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  
  pdVar2 = (measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = dt;
  if ((long)(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 != 0x58) {
    __assert_fail("measurement.size() == m_I(MI::NUM_MEASUREMENTS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                  ,0x2a,
                  "void ins_ekf::InsEkf::ProcessMeasurement(const std::vector<double> &, double)");
  }
  local_a8.m_xpr = &local_48;
  local_a8.m_row = 0;
  local_a8.m_col = 1;
  local_a8.m_currentBlockRows = 1;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar2;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_a8,pdVar2 + 1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (pCVar5,(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + 2);
  if ((local_a8.m_currentBlockRows + local_a8.m_row == 3) &&
     ((double)local_a8.m_col == 4.94065645841247e-324)) {
    pdVar2 = (measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_a8.m_xpr = &local_68;
    local_a8.m_row = 0;
    local_a8.m_col = 1;
    local_a8.m_currentBlockRows = 1;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = pdVar2[3];
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_a8,pdVar2 + 4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar5,(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 5);
    if ((local_a8.m_currentBlockRows + local_a8.m_row == 3) &&
       ((double)local_a8.m_col == 4.94065645841247e-324)) {
      RotateVectByQuat((Vector3d *)&local_a8,&this->imu_orientation_,&local_48);
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (double)local_a8.m_col;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_a8.m_xpr;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_a8.m_row;
      RotateVectByQuat((Vector3d *)&local_a8,&this->imu_orientation_,&local_68);
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (double)local_a8.m_col;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_a8.m_xpr;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_a8.m_row;
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[0] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[1] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[2] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[3] = (double)local_a8.m_xpr;
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[4] = (double)local_a8.m_row;
      (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
      m_storage.m_data.array[5] = (double)local_a8.m_col;
      if (this->gps_update_rate_ <= ProcessMeasurement::t_since_last_gps) {
        local_a8.m_xpr =
             (Matrix<double,_3,_1,_0,_3,_1> *)
             ((measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start + 6);
        local_a8.m_row = 5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,
                   (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_a8);
        if (local_70 != 5) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 11, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 11, 1>, -1, 1>]"
                       );
        }
        (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
        m_storage.m_data.array[6] = *local_78;
        uVar6 = 0xffffffffffffffff;
        do {
          dVar4 = (local_78 + uVar6 + 2)[1];
          pdVar1 = (this->last_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                   array + uVar6 + 8;
          *pdVar1 = local_78[uVar6 + 2];
          pdVar1[1] = dVar4;
          uVar6 = uVar6 + 2;
        } while (uVar6 < 3);
        ProcessMeasurement::t_since_last_gps = 0.0;
        free(local_78);
      }
      else {
        local_88 = ProcessMeasurement::t_since_last_gps;
        dVar4 = nan("");
        (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
        m_storage.m_data.array[6] = dVar4;
        uVar6 = 0xffffffffffffffff;
        do {
          auVar3._8_4_ = SUB84(dVar4,0);
          auVar3._0_8_ = dVar4;
          auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
          *(undefined1 (*) [16])
           ((this->last_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array +
           uVar6 + 8) = auVar3;
          uVar6 = uVar6 + 2;
        } while (uVar6 < 3);
        ProcessMeasurement::t_since_last_gps = local_88 + local_80;
      }
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

void InsEkf::ProcessMeasurement(const std::vector<double>& measurement, double dt) {

        static double t_since_last_gps = 0.0;
        assert(measurement.size() == m_I(MI::NUM_MEASUREMENTS));

        Eigen::Vector3d pqr_meas, axyz_meas;
        pqr_meas << measurement[m_I(MI::p)], measurement[m_I(MI::q)], measurement[m_I(MI::r)];
        axyz_meas << measurement[m_I(MI::ax)], measurement[m_I(MI::ay)], measurement[m_I(MI::az)];

        // transform measurements from sensor frame to vehicle body frame
        pqr_meas = RotateVectByQuat(imu_orientation_, pqr_meas);
        axyz_meas = RotateVectByQuat(imu_orientation_, axyz_meas);

        last_measurements_.segment(m_I(MI::p), 3) = pqr_meas;
        last_measurements_.segment(m_I(MI::ax), 3) = axyz_meas;

        // capture GPS measurements if they are available
        if(t_since_last_gps >= gps_update_rate_){
            const Eigen::VectorXd gps_meas = Eigen::Map<const Eigen::VectorXd>(measurement.data() + 6, 5);
            last_measurements_.segment(m_I(MI::gpsX), 5) = gps_meas;
            t_since_last_gps = 0;
        }else {
            last_measurements_.segment(m_I(MI::gpsX), 5).setConstant(std::nan(""));
            t_since_last_gps += dt;
        }
    }